

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::Generators::
Generators<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>::populate
          (Generators<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>
           *this,unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128> *val)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  pointer *__ptr;
  GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>
  local_18;
  
  local_18.m_generator._M_t.
  super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
  .
  super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
        )operator_new(0x28);
  *(undefined ***)
   local_18.m_generator._M_t.
   super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
   .
   super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_false>
   ._M_head_impl = &PTR__GeneratorUntypedBase_0031b400;
  uVar1 = (val->a).m_hi;
  uVar2 = (val->y).m_lo;
  uVar3 = (val->y).m_hi;
  *(uint64_t *)
   ((long)local_18.m_generator._M_t.
          super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
          .
          super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_false>
          ._M_head_impl + 8) = (val->a).m_lo;
  *(uint64_t *)
   ((long)local_18.m_generator._M_t.
          super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
          .
          super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_false>
          ._M_head_impl + 0x10) = uVar1;
  *(uint64_t *)
   ((long)local_18.m_generator._M_t.
          super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
          .
          super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_false>
          ._M_head_impl + 0x18) = uVar2;
  *(uint64_t *)
   ((long)local_18.m_generator._M_t.
          super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
          .
          super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_false>
          ._M_head_impl + 0x20) = uVar3;
  std::
  vector<Catch::Generators::GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128>>,std::allocator<Catch::Generators::GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128>>>>
  ::
  emplace_back<Catch::Generators::GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128>>>
            ((vector<Catch::Generators::GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128>>,std::allocator<Catch::Generators::GeneratorWrapper<unary_op_tuple<trng::portable_impl::uint128,trng::portable_impl::uint128>>>>
              *)&this->m_generators,&local_18);
  if (local_18.m_generator._M_t.
      super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
      .
      super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_18.m_generator._M_t.
                          super___uniq_ptr_impl<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
                          .
                          super__Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  return;
}

Assistant:

void populate(T&& val) {
            m_generators.emplace_back(value(std::forward<T>(val)));
        }